

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

string * __thiscall
cmGeneratorTarget::GetFrameworkVersion_abi_cxx11_
          (string *__return_storage_ptr__,cmGeneratorTarget *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TargetType TVar2;
  char *__s;
  size_t sVar3;
  char *pcVar4;
  size_type __dnew;
  string local_48;
  size_type local_28;
  
  TVar2 = cmTarget::GetType(this->Target);
  if (TVar2 == INTERFACE_LIBRARY) {
    __assert_fail("this->GetType() != cmStateEnums::INTERFACE_LIBRARY",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmGeneratorTarget.cxx"
                  ,0x138f,"std::string cmGeneratorTarget::GetFrameworkVersion() const");
  }
  paVar1 = &local_48.field_2;
  local_28 = 0x11;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  local_48._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_48,(ulong)&local_28);
  local_48.field_2._M_allocated_capacity = local_28;
  *(undefined8 *)local_48._M_dataplus._M_p = 0x524f57454d415246;
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p + 8) = 'K';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p + 9) = '_';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p + 10) = 'V';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p + 0xb) = 'E';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p + 0xc) = 'R';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p + 0xd) = 'S';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p + 0xe) = 'I';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p + 0xf) = 'O';
  local_48._M_dataplus._M_p[0x10] = 'N';
  local_48._M_string_length = local_28;
  local_48._M_dataplus._M_p[local_28] = '\0';
  __s = GetProperty(this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (__s == (char *)0x0) {
    local_48._M_string_length = 7;
    local_48.field_2._M_allocated_capacity = 0x4e4f4953524556;
    local_48._M_dataplus._M_p = (pointer)paVar1;
    __s = GetProperty(this,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (__s == (char *)0x0) {
      *(undefined2 *)&__return_storage_ptr__->field_2 = 0x41;
      __return_storage_ptr__->_M_string_length = 1;
      return __return_storage_ptr__;
    }
    sVar3 = strlen(__s);
    pcVar4 = __s + sVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar3 = strlen(__s);
    pcVar4 = __s + sVar3;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,__s,pcVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetFrameworkVersion() const
{
  assert(this->GetType() != cmStateEnums::INTERFACE_LIBRARY);

  if (const char* fversion = this->GetProperty("FRAMEWORK_VERSION")) {
    return fversion;
  }
  if (const char* tversion = this->GetProperty("VERSION")) {
    return tversion;
  }
  return "A";
}